

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereRecord2.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::SphereRecord2::Encode(SphereRecord2 *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  SphereRecord2 *this_local;
  
  pKVar1 = KDataStream::operator<<
                     (stream,(this->super_SphereRecord1).super_BoundingSphereRecord.
                             super_EnvironmentRecord.m_ui32EnvRecTyp);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_SphereRecord1).super_BoundingSphereRecord.
                             super_EnvironmentRecord.m_ui16Length);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_SphereRecord1).super_BoundingSphereRecord.
                             super_EnvironmentRecord.m_ui8Index);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_SphereRecord1).super_BoundingSphereRecord.
                             super_EnvironmentRecord.m_ui8Padding);
  pKVar1 = DATA_TYPE::operator<<
                     (pKVar1,&(this->super_SphereRecord1).super_BoundingSphereRecord.m_CentLocation.
                              super_DataTypeBase);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(float)(this->super_SphereRecord1).super_BoundingSphereRecord.m_f32Rad)
  ;
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32ddt);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Velocity).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar1,&(this->m_AngularVelocity).super_DataTypeBase);
  return;
}

Assistant:

void SphereRecord2::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_CentLocation
           << m_f32Rad
           << m_f32ddt
           << KDIS_STREAM m_Velocity
           << KDIS_STREAM m_AngularVelocity;
}